

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_absdif_b(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2)

{
  int32_t iVar1;
  int32_t iVar2;
  bool local_35;
  uint local_34;
  uint local_30;
  uint local_2c;
  int32_t ret;
  int32_t avf;
  int32_t ovf;
  int32_t extr_r2;
  int32_t i;
  int32_t b;
  target_ulong_conflict r2_local;
  target_ulong_conflict r1_local;
  CPUTriCoreState *env_local;
  
  ret = 0;
  local_2c = 0;
  local_30 = 0;
  for (ovf = 0; ovf < 4; ovf = ovf + 1) {
    iVar1 = sextract32(r2,ovf << 3,8);
    iVar2 = sextract32(r1,ovf << 3,8);
    if (iVar1 < iVar2) {
      local_34 = iVar2 - iVar1;
    }
    else {
      local_34 = iVar1 - iVar2;
    }
    local_35 = 0x7f < (int)local_34 || (int)local_34 < -0x80;
    ret = (uint)local_35 | ret;
    local_2c = local_34 ^ local_34 << 1 | local_2c;
    local_30 = (local_34 & 0xff) << ((byte)(ovf << 3) & 0x1f) | local_30;
  }
  env->PSW_USB_V = ret << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_V | env->PSW_USB_SV;
  env->PSW_USB_AV = local_2c << 0x18;
  env->PSW_USB_SAV = env->PSW_USB_AV | env->PSW_USB_SAV;
  return local_30;
}

Assistant:

uint32_t helper_absdif_b(CPUTriCoreState *env, target_ulong r1, target_ulong r2)
{
    int32_t b, i;
    int32_t extr_r2;
    int32_t ovf = 0;
    int32_t avf = 0;
    int32_t ret = 0;

    for (i = 0; i < 4; i++) {
        extr_r2 = sextract32(r2, i * 8, 8);
        b = sextract32(r1, i * 8, 8);
        b = (b > extr_r2) ? (b - extr_r2) : (extr_r2 - b);
        ovf |= (b > 0x7F) || (b < -0x80);
        avf |= b ^ b * 2u;
        ret |= (b & 0xff) << (i * 8);
    }

    env->PSW_USB_V = ovf << 31;
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 24;
    env->PSW_USB_SAV |= env->PSW_USB_AV;
    return ret;
}